

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCryptoHash.cxx
# Opt level: O0

string * __thiscall
cmCryptoHash::HashString(string *__return_storage_ptr__,cmCryptoHash *this,string *input)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *hash;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  string *local_20;
  string *input_local;
  cmCryptoHash *this_local;
  
  local_20 = input;
  input_local = (string *)this;
  this_local = (cmCryptoHash *)__return_storage_ptr__;
  ByteHashString(&local_38,this,input);
  ByteHashToString_abi_cxx11_(__return_storage_ptr__,(cmCryptoHash *)&local_38,hash);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCryptoHash::HashString(const std::string& input)
{
  return ByteHashToString(this->ByteHashString(input));
}